

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O3

void __thiscall
Memory::RecyclerSweep::
TransferPendingEmptyHeapBlocks<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
          *heapBucket)

{
  uint32 *puVar1;
  HeapBlockList *this_00;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *tail_00;
  code *pcVar2;
  bool bVar3;
  uint in_EAX;
  uint uVar4;
  undefined4 *puVar5;
  uint32 *in_R8;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *tail;
  anon_class_16_2_f79d628a fn;
  undefined1 auStack_38 [12];
  uint32 count;
  
  auStack_38._0_4_ = in_EAX;
  bVar3 = IsBackground(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xbe,"(!this->IsBackground())","!this->IsBackground()");
    if (!bVar3) goto LAB_006bb82d;
    *puVar5 = 0;
  }
  bVar3 = HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
          ::IsAllocationStopped(heapBucket);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xbf,"(!heapBucket->IsAllocationStopped())",
                       "!heapBucket->IsAllocationStopped()");
    if (!bVar3) goto LAB_006bb82d;
    *puVar5 = 0;
  }
  SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::GetNonEmptyHeapBlockCount
            ((SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
              *)heapBucket,true);
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  GetEmptyHeapBlockCount(heapBucket);
  uVar4 = HeapInfo::GetMediumBucketIndex((ulong)(heapBucket->super_HeapBucket).sizeCat);
  if ((this->mediumFinalizableWithBarrierData).bucketData[uVar4].pendingSweepList !=
      (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xc3,"(bucketData.pendingSweepList == nullptr)",
                       "bucketData.pendingSweepList == nullptr");
    if (!bVar3) goto LAB_006bb82d;
    *puVar5 = 0;
  }
  this_00 = (HeapBlockList *)
            (this->mediumFinalizableWithBarrierData).bucketData[uVar4].pendingEmptyBlockList;
  tail_00 = (this->mediumFinalizableWithBarrierData).bucketData[uVar4].pendingEmptyBlockListTail;
  if (this_00 == (HeapBlockList *)0x0) {
    if (tail_00 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xe2,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                         "bucketData.pendingEmptyBlockListTail == nullptr");
      if (!bVar3) {
LAB_006bb82d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  else {
    auStack_38._4_4_ = 0;
    fn.count = in_R8;
    fn.tail = (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
              (auStack_38 + 4);
    HeapBlockList::
    ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::RecyclerSweep::TransferPendingEmptyHeapBlocks<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>(Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
              (this_00,(SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0
               ,tail_00,fn);
    puVar1 = &(heapBucket->super_HeapBucket).emptyHeapBlockCount;
    *puVar1 = *puVar1 + auStack_38._4_4_;
    puVar1 = &(heapBucket->super_HeapBucket).heapBlockCount;
    *puVar1 = *puVar1 - auStack_38._4_4_;
    (tail_00->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
    super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
    super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next =
         (SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBucket->emptyBlockList;
    heapBucket->emptyBlockList =
         (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)this_00;
    (this->mediumFinalizableWithBarrierData).bucketData[uVar4].pendingEmptyBlockList =
         (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
    ::GetNonEmptyHeapBlockCount
              ((SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                *)heapBucket,true);
    HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
    GetEmptyHeapBlockCount(heapBucket);
  }
  return;
}

Assistant:

void
RecyclerSweep::TransferPendingEmptyHeapBlocks(HeapBucketT<TBlockType> * heapBucket)
{
    Assert(!this->IsBackground());
    Assert(!heapBucket->IsAllocationStopped());
    RECYCLER_SLOW_CHECK(heapBucket->VerifyHeapBlockCount(false));

    auto& bucketData = this->GetBucketData(heapBucket);
    Assert(bucketData.pendingSweepList == nullptr);
    TBlockType * list = bucketData.pendingEmptyBlockList;
    if (list)
    {
        TBlockType * tail = bucketData.pendingEmptyBlockListTail;
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        uint32 count = 0;
        HeapBlockList::ForEach(list, [tail, &count](TBlockType * heapBlock)
        {
            Assert(heapBlock->GetAddress() == nullptr);
            Assert(heapBlock->GetSegment() == nullptr);
            Assert(heapBlock->GetNextBlock() != nullptr || heapBlock == tail);
            count++;
        });
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        heapBucket->emptyHeapBlockCount += count;
#endif
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        heapBucket->heapBlockCount -= count;
#endif
#endif


        tail->SetNextBlock(heapBucket->emptyBlockList);
        heapBucket->emptyBlockList = list;

        bucketData.pendingEmptyBlockList = nullptr;
        RECYCLER_SLOW_CHECK(heapBucket->VerifyHeapBlockCount(false));
    }
    else
    {
        Assert(bucketData.pendingEmptyBlockListTail == nullptr);
    }
}